

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_cast_helpers.hpp
# Opt level: O3

uchar duckdb::VectorDecimalCastOperator<duckdb::TryCastFromDecimal>::Operation<int,unsigned_char>
                (int input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  bool bVar1;
  uchar result_value;
  uchar local_49;
  string local_48;
  
  bVar1 = TryCastFromDecimal::Operation<int,unsigned_char>
                    (input,&local_49,*(CastParameters **)((long)dataptr + 8),
                     *(uint8_t *)((long)dataptr + 0x18),*(uint8_t *)((long)dataptr + 0x19));
  if (!bVar1) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,"Failed to cast decimal value","");
    local_49 = HandleVectorCastError::Operation<unsigned_char>
                         (&local_48,mask,idx,(VectorTryCastData *)dataptr);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  return local_49;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		auto data = reinterpret_cast<VectorDecimalCastData *>(dataptr);
		RESULT_TYPE result_value;
		if (!OP::template Operation<INPUT_TYPE, RESULT_TYPE>(input, result_value, data->vector_cast_data.parameters,
		                                                     data->width, data->scale)) {
			return HandleVectorCastError::Operation<RESULT_TYPE>("Failed to cast decimal value", mask, idx,
			                                                     data->vector_cast_data);
		}
		return result_value;
	}